

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_container.cpp
# Opt level: O1

int32_t __thiscall cppnet::TimerContainer::MinTime(TimerContainer *this)

{
  element_type *peVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = LocalMinTime(this);
  peVar1 = (this->_sub_timer).super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar3 = (*(peVar1->super_Timer)._vptr_Timer[2])();
    iVar4 = (*(((this->_sub_timer).
                super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_Timer)._vptr_Timer[3])();
    if (iVar3 < 1) {
      iVar3 = 0;
      if (0 < iVar2) {
        iVar3 = iVar4;
      }
      iVar2 = iVar2 - iVar3;
    }
    else {
      iVar4 = iVar2 - iVar4;
      iVar2 = iVar3;
      if ((0 < iVar4) && (iVar2 = iVar4, iVar3 < iVar4)) {
        iVar2 = iVar3;
      }
    }
  }
  return iVar2;
}

Assistant:

int32_t TimerContainer::MinTime() {
    uint32_t past_time = 0;
    int32_t sub_time = 0;
    int32_t local_time = LocalMinTime();

    if (_sub_timer) {
        sub_time = _sub_timer->MinTime();
        past_time += _sub_timer->CurrentTimer();

        if (sub_time > 0) {
            local_time = local_time - past_time;
            if (local_time > 0) {
                return std::min(local_time, sub_time);
            }
            return sub_time;

        } else if (local_time > 0){
            return local_time - past_time;
        }
    }

    return local_time;
}